

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdrivr.c
# Opt level: O0

FT_Error cff_get_cmap_info(FT_CharMap charmap,TT_CMapInfo *cmap_info)

{
  FT_Module module;
  long *plVar1;
  FT_Service_TTCMaps service;
  FT_Module sfnt;
  FT_Library library;
  FT_Face face;
  FT_Error error;
  FT_CMap cmap;
  TT_CMapInfo *cmap_info_local;
  FT_CharMap charmap_local;
  
  face._4_4_ = 0;
  if ((charmap[1].face == (FT_Face)&cff_cmap_encoding_class_rec) ||
     (charmap[1].face == (FT_Face)&cff_cmap_unicode_class_rec)) {
    face._4_4_ = 0x96;
  }
  else {
    module = FT_Get_Module((charmap->face->driver->root).library,"sfnt");
    plVar1 = (long *)ft_module_get_service(module,"tt-cmaps",'\0');
    if ((plVar1 != (long *)0x0) && (*plVar1 != 0)) {
      face._4_4_ = (*(code *)*plVar1)(charmap,cmap_info);
    }
  }
  return face._4_4_;
}

Assistant:

static FT_Error
  cff_get_cmap_info( FT_CharMap    charmap,
                     TT_CMapInfo  *cmap_info )
  {
    FT_CMap   cmap  = FT_CMAP( charmap );
    FT_Error  error = FT_Err_Ok;

    FT_Face     face    = FT_CMAP_FACE( cmap );
    FT_Library  library = FT_FACE_LIBRARY( face );


    if ( cmap->clazz != &CFF_CMAP_ENCODING_CLASS_REC_GET &&
         cmap->clazz != &CFF_CMAP_UNICODE_CLASS_REC_GET  )
    {
      FT_Module           sfnt    = FT_Get_Module( library, "sfnt" );
      FT_Service_TTCMaps  service =
        (FT_Service_TTCMaps)ft_module_get_service( sfnt,
                                                   FT_SERVICE_ID_TT_CMAP,
                                                   0 );


      if ( service && service->get_cmap_info )
        error = service->get_cmap_info( charmap, cmap_info );
    }
    else
      error = FT_THROW( Invalid_CharMap_Format );

    return error;
  }